

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

int nn_dist_send(nn_dist *self,nn_msg *msg,nn_pipe *exclude)

{
  nn_list *self_00;
  uint uVar1;
  nn_list_item *item;
  nn_list_item *pnVar2;
  nn_msg copy;
  nn_msg local_90;
  
  if (self->count != 0) {
    nn_msg_bulkcopy_start(msg,self->count);
    self_00 = &self->pipes;
    item = nn_list_begin(self_00);
    pnVar2 = nn_list_end(self_00);
    if (item != pnVar2) {
      do {
        nn_msg_bulkcopy_cp(&local_90,msg);
        if (item[1].next == (nn_list_item *)exclude) {
          nn_msg_term(&local_90);
LAB_0013356a:
          item = nn_list_next(self_00,item);
        }
        else {
          uVar1 = nn_pipe_send((nn_pipe *)item[1].next,&local_90);
          if ((int)uVar1 < 0) {
            nn_dist_send_cold_1();
          }
          if ((uVar1 & 1) == 0) goto LAB_0013356a;
          self->count = self->count - 1;
          item = nn_list_erase(self_00,item);
        }
        pnVar2 = nn_list_end(self_00);
      } while (item != pnVar2);
    }
  }
  nn_msg_term(msg);
  return 0;
}

Assistant:

int nn_dist_send (struct nn_dist *self, struct nn_msg *msg,
    struct nn_pipe *exclude)
{
    int rc;
    struct nn_list_item *it;
    struct nn_dist_data *data;
    struct nn_msg copy;

    /*  TODO: We can optimise for the case when there's only one outbound
        pipe here. No message copying is needed in such case. */

    /*  In the specific case when there are no outbound pipes. There's nowhere
        to send the message to. Deallocate it. */
    if (nn_slow (self->count) == 0) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message to all the subscribers. */
    nn_msg_bulkcopy_start (msg, self->count);
    it = nn_list_begin (&self->pipes);
    while (it != nn_list_end (&self->pipes)) {
       data = nn_cont (it, struct nn_dist_data, item);
       nn_msg_bulkcopy_cp (&copy, msg);
       if (nn_fast (data->pipe == exclude)) {
           nn_msg_term (&copy);
       }
       else {
           rc = nn_pipe_send (data->pipe, &copy);
           errnum_assert (rc >= 0, -rc);
           if (rc & NN_PIPE_RELEASE) {
               --self->count;
               it = nn_list_erase (&self->pipes, it);
               continue;
           }
       }
       it = nn_list_next (&self->pipes, it);
    }
    nn_msg_term (msg);

    return 0;
}